

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * valueAsString<bool>(string *__return_storage_ptr__,bool value)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  allocator local_9;
  
  pcVar1 = "FALSE";
  if ((int)CONCAT71(in_register_00000031,value) != 0) {
    pcVar1 = "TRUE";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string valueAsString<bool>(bool value)
{
  return value ? "TRUE" : "FALSE";
}